

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O2

Vec_Int_t * Gia_ManGetStateAndCheckCex(Gia_Man_t *pAig,Abc_Cex_t *p,int iFrame)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  Vec_Int_t *vInit;
  
  iVar7 = pAig->nRegs;
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  if (iVar7 - 1U < 0xf) {
    iVar7 = 0x10;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar7;
  if (iVar7 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar1->pArray = piVar2;
  vInit = pVVar1;
  if ((iFrame < 0) || (p->iFrame < iFrame)) {
    __assert_fail("iFrame >= 0 && iFrame <= p->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                  ,0x100,"Vec_Int_t *Gia_ManGetStateAndCheckCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  Gia_ManCleanMark0(pAig);
  for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->field_0x3 = pGVar3->field_0x3 & 0xbf;
  }
  iVar6 = 0;
  iVar7 = p->nRegs;
  do {
    if (p->iFrame < iVar6) {
LAB_004f820c:
      if (iVar7 == p->nBits) {
        pGVar3 = Gia_ManPo(pAig,p->iPo);
        if ((pGVar3->field_0x3 & 0x40) == 0) {
          Vec_IntFreeP(&vInit);
          pVVar1 = vInit;
        }
        Gia_ManCleanMark0(pAig);
        return pVVar1;
      }
      __assert_fail("iBit == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                    ,0x117,"Vec_Int_t *Gia_ManGetStateAndCheckCex(Gia_Man_t *, Abc_Cex_t *, int)");
    }
    if (iVar6 == iFrame) {
      for (iVar8 = 0; iVar8 < pAig->nRegs; iVar8 = iVar8 + 1) {
        pGVar3 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar8);
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar5 = *(uint *)pGVar3;
        iVar10 = pVVar1->nSize;
        if (iVar10 == pVVar1->nCap) {
          uVar11 = (ulong)(uint)(iVar10 * 2);
          if (iVar10 < 0x10) {
            uVar11 = 0x10;
          }
          piVar2 = pVVar1->pArray;
          if (iVar10 < (int)uVar11) {
            if (piVar2 == (int *)0x0) {
              piVar2 = (int *)malloc(uVar11 << 2);
            }
            else {
              piVar2 = (int *)realloc(piVar2,uVar11 << 2);
            }
            pVVar1->pArray = piVar2;
            if (piVar2 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar1->nCap = (int)uVar11;
            iVar10 = pVVar1->nSize;
          }
        }
        else {
          piVar2 = pVVar1->pArray;
        }
        pVVar1->nSize = iVar10 + 1;
        piVar2[iVar10] = uVar5 >> 0x1e & 1;
      }
    }
    iVar8 = 0;
    while( true ) {
      iVar10 = iVar7 + iVar8;
      if (pAig->vCis->nSize - pAig->nRegs <= iVar8) break;
      pGVar3 = Gia_ManCi(pAig,iVar8);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)(((uint)(&p[1].iPo)[iVar10 >> 5] >> ((byte)iVar10 & 0x1f) & 1) << 0x1e);
      iVar8 = iVar8 + 1;
    }
    for (iVar9 = 0; iVar9 < pAig->nObjs; iVar9 = iVar9 + 1) {
      pGVar3 = Gia_ManObj(pAig,iVar9);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)pGVar3;
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar5 = (uint)(uVar11 >> 0x20);
        *(ulong *)pGVar3 =
             uVar11 & 0xffffffff3fffffff |
             (ulong)(((uVar5 >> 0x1d ^ *(uint *)(pGVar3 + -(ulong)(uVar5 & 0x1fffffff)) >> 0x1e) &
                      ((uint)(uVar11 >> 0x1d) & 7 ^
                      *(uint *)(pGVar3 + -(uVar11 & 0x1fffffff)) >> 0x1e) & 1) << 0x1e);
      }
    }
    for (iVar9 = 0; iVar9 < pAig->vCos->nSize; iVar9 = iVar9 + 1) {
      pGVar3 = Gia_ManCo(pAig,iVar9);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar5 = (uint)*(ulong *)pGVar3;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)((uVar5 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar5 & 0x1fffffff))) & 0x40000000);
    }
    if (iVar6 == p->iFrame) {
      iVar7 = iVar7 + iVar8;
      goto LAB_004f820c;
    }
    for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
      pGVar3 = Gia_ManCo(pAig,(pAig->vCos->nSize - pAig->nRegs) + iVar7);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar4 = Gia_ManCi(pAig,(pAig->vCis->nSize - pAig->nRegs) + iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xffffffffbfffffff | (ulong)((uint)*(undefined8 *)pGVar3 & 0x40000000)
      ;
    }
    iVar6 = iVar6 + 1;
    iVar7 = iVar10;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManGetStateAndCheckCex( Gia_Man_t * pAig, Abc_Cex_t * p, int iFrame )
{
    Vec_Int_t * vInit = Vec_IntAlloc( Gia_ManRegNum(pAig) );
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    assert( iFrame >= 0 && iFrame <= p->iFrame );
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = 0;//Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0, iBit = p->nRegs; i <= p->iFrame; i++ )
    {
        if ( i == iFrame )
        {
            Gia_ManForEachRo( pAig, pObjRo, k )
                Vec_IntPush( vInit, pObjRo->fMark0 );
        }
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    RetValue = Gia_ManPo(pAig, p->iPo)->fMark0;
    if ( RetValue != 1 )
        Vec_IntFreeP( &vInit );
    Gia_ManCleanMark0(pAig);
    return vInit;
}